

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::OpenCompactionOutputFile(DBImpl *this,CompactionState *compact)

{
  TableBuilder *this_00;
  long in_RDX;
  uint64_t file_number;
  string fname;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  if (in_RDX == 0) {
    __assert_fail("compact != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x312,"Status leveldb::DBImpl::OpenCompactionOutputFile(CompactionState *)");
  }
  if (*(long *)(in_RDX + 0x30) == 0) {
    std::mutex::lock((mutex *)&compact[3].smallest_snapshot);
    file_number = (uint64_t)compact[8].outfile[9]._vptr_WritableFile;
    compact[8].outfile[9]._vptr_WritableFile = (_func_int **)(file_number + 1);
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&compact[7].outfile,&file_number);
    fname.field_2._M_allocated_capacity = (size_type)&local_58;
    local_48._M_p = (pointer)&local_38;
    fname._M_dataplus._M_p = (pointer)file_number;
    fname.field_2._8_8_ = 0;
    local_58._M_local_buf[0] = '\0';
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    std::
    vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ::push_back((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                 *)(in_RDX + 0x10),(value_type *)&fname);
    pthread_mutex_unlock((pthread_mutex_t *)&compact[3].smallest_snapshot);
    CompactionState::Output::~Output((Output *)&fname);
    TableFileName(&fname,(string *)
                         &compact[2].outputs.
                          super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                          ._M_impl.super__Vector_impl_data._M_finish,file_number);
    (**(code **)(*(long *)compact->smallest_snapshot + 0x20))
              (this,(long *)compact->smallest_snapshot,&fname,(undefined8 *)(in_RDX + 0x28));
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      this_00 = (TableBuilder *)operator_new(8);
      TableBuilder::TableBuilder
                (this_00,(Options *)&compact->builder,*(WritableFile **)(in_RDX + 0x28));
      *(TableBuilder **)(in_RDX + 0x30) = this_00;
    }
    std::__cxx11::string::~string((string *)&fname);
    return (Status)(char *)this;
  }
  __assert_fail("compact->builder == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                ,0x313,"Status leveldb::DBImpl::OpenCompactionOutputFile(CompactionState *)");
}

Assistant:

Status DBImpl::OpenCompactionOutputFile(CompactionState* compact) {
  assert(compact != nullptr);
  assert(compact->builder == nullptr);
  uint64_t file_number;
  {
    mutex_.Lock();
    file_number = versions_->NewFileNumber();
    pending_outputs_.insert(file_number);
    CompactionState::Output out;
    out.number = file_number;
    out.smallest.Clear();
    out.largest.Clear();
    compact->outputs.push_back(out);
    mutex_.Unlock();
  }

  // Make the output file
  std::string fname = TableFileName(dbname_, file_number);
  Status s = env_->NewWritableFile(fname, &compact->outfile);
  if (s.ok()) {
    compact->builder = new TableBuilder(options_, compact->outfile);
  }
  return s;
}